

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTimeCoordinator.cpp
# Opt level: O3

void __thiscall
helics::BaseTimeCoordinator::enteringExecMode(BaseTimeCoordinator *this,IterationRequest param_1)

{
  int iVar1;
  pointer pDVar2;
  _Alloc_hider __src;
  bool bVar3;
  bool bVar4;
  pointer pDVar5;
  undefined7 in_register_00000031;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> res;
  ActionMessage error;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  ActionMessage local_d8;
  
  if (this->executionMode != false) {
    return;
  }
  this->checkingExec = true;
  if ((this->dependencies).dependencies.
      super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->dependencies).dependencies.
      super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this->noParent = true;
  }
  else {
    (*this->_vptr_BaseTimeCoordinator[2])(this,CONCAT71(in_register_00000031,param_1));
    TimeDependencies::checkForIssues_abi_cxx11_(&local_100,&this->dependencies,false);
    iVar1 = local_100.first;
    if (local_100.first != 0) {
      ActionMessage::ActionMessage(&local_d8,cmd_global_error);
      __src._M_p = local_100.second._M_dataplus._M_p;
      local_d8.dest_id.gid = 0;
      local_d8.source_id.gid = (this->mSourceId).gid;
      local_d8.messageID = local_100.first;
      if ((byte *)local_100.second._M_dataplus._M_p == local_d8.payload.heap) {
        local_d8.payload.bufferSize = local_100.second._M_string_length;
      }
      else {
        SmallBuffer::reserve(&local_d8.payload,local_100.second._M_string_length);
        local_d8.payload.bufferSize = local_100.second._M_string_length;
        if (local_100.second._M_string_length != 0) {
          memcpy(local_d8.payload.heap,__src._M_p,local_100.second._M_string_length);
        }
      }
      if ((this->sendMessageFunction).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*(this->sendMessageFunction)._M_invoker)((_Any_data *)&this->sendMessageFunction,&local_d8);
      ActionMessage::~ActionMessage(&local_d8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100.second._M_dataplus._M_p != &local_100.second.field_2) {
      operator_delete(local_100.second._M_dataplus._M_p,
                      local_100.second.field_2._M_allocated_capacity + 1);
    }
    if (iVar1 != 0) {
      return;
    }
    pDVar5 = (this->dependencies).dependencies.
             super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pDVar2 = (this->dependencies).dependencies.
             super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    this->noParent = true;
    if (pDVar5 != pDVar2) {
      bVar4 = true;
      bVar3 = true;
      do {
        if (pDVar5->connection == CHILD) {
          iVar1 = (pDVar5->fedID).gid;
          if (iVar1 == 1) {
            bVar4 = false;
          }
          bVar3 = bVar4;
          if (0x6fffffff < iVar1) {
            bVar3 = false;
            bVar4 = false;
          }
        }
        else if (pDVar5->connection == PARENT) {
          this->noParent = false;
          bVar3 = false;
          break;
        }
        pDVar5 = pDVar5 + 1;
      } while (pDVar5 != pDVar2);
      goto LAB_00353b05;
    }
  }
  bVar3 = true;
LAB_00353b05:
  this->federatesOnly = bVar3;
  sendTimingInfo(this);
  return;
}

Assistant:

void BaseTimeCoordinator::enteringExecMode(IterationRequest /*mode*/)
{
    if (executionMode) {
        return;
    }
    checkingExec = true;
    if (!dependencies.empty()) {
        updateTimeFactors();
        auto res = dependencies.checkForIssues(false);
        if (res.first != 0) {
            ActionMessage error(CMD_GLOBAL_ERROR);
            error.dest_id = parent_broker_id;
            error.source_id = mSourceId;
            error.messageID = res.first;
            error.payload = res.second;
            sendMessageFunction(error);
            return;
        }
    }
    bool fedOnly = true;
    noParent = true;
    for (const auto& dep : dependencies) {
        if (dep.connection == ConnectionType::PARENT) {
            fedOnly = false;
            noParent = false;
            break;
        }
        if (dep.connection == ConnectionType::CHILD && dep.fedID.isBroker()) {
            fedOnly = false;
        }
    }
    federatesOnly = fedOnly;
    sendTimingInfo();
}